

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStr.c
# Opt level: O1

int Str_MuxRestructureArea
              (Gia_Man_t *pNew,Str_Ntk_t *pNtk,int iMux,int nMuxes,Vec_Int_t *vDelay,int nLutSize,
              int fVerbose)

{
  uint uVar1;
  int iVar2;
  Str_Mux_t aSStack_9c428 [10000];
  
  iVar2 = -1;
  if (nMuxes < 10000) {
    Str_MuxCreate(aSStack_9c428,pNtk,iMux,nMuxes,vDelay,nLutSize);
    uVar1 = Str_MuxRestructArea_rec(pNew,aSStack_9c428,aSStack_9c428,0,vDelay,fVerbose);
    if (2 < uVar1) {
      __assert_fail("Result >= 0 && Result <= 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaStr.c"
                    ,0x73f,
                    "int Str_MuxRestructureArea(Gia_Man_t *, Str_Ntk_t *, int, int, Vec_Int_t *, int, int)"
                   );
    }
    iVar2 = Str_MuxToGia_rec(pNew,aSStack_9c428,0,vDelay);
  }
  return iVar2;
}

Assistant:

int Str_MuxRestructureArea( Gia_Man_t * pNew, Str_Ntk_t * pNtk, int iMux, int nMuxes, Vec_Int_t * vDelay, int nLutSize, int fVerbose )
{
    int Limit = MAX_TREE;
    Str_Mux_t pTree[MAX_TREE];
    int Result;
    if ( nMuxes >= Limit )
        return -1;
    assert( nMuxes < Limit );
    Str_MuxCreate( pTree, pNtk, iMux, nMuxes, vDelay, nLutSize );
    Result = Str_MuxRestructArea_rec( pNew, pTree, pTree, 0, vDelay, fVerbose );
    assert( Result >= 0 && Result <= 2 );
    return Str_MuxToGia_rec( pNew, pTree, 0, vDelay );
}